

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

void lrot32(void *blob,int len,int c)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  sbyte sVar5;
  uint in_EDX;
  uint in_ESI;
  undefined4 *in_RDI;
  uint32_t b_1;
  uint32_t a;
  int i_1;
  uint32_t t;
  int i;
  uint32_t t_1;
  int j;
  int b;
  uint32_t *k;
  int ndwords;
  int nbytes;
  uint local_44;
  int local_38;
  int local_30;
  int local_28;
  
  assert((in_ESI & 3) == 0);
  iVar4 = (int)in_ESI / 4;
  if (in_EDX != 0) {
    for (local_28 = 0; local_28 < (int)in_EDX / 0x20; local_28 = local_28 + 1) {
      uVar1 = in_RDI[iVar4 + -1];
      iVar3 = iVar4;
      while (local_30 = iVar3 + -1, 0 < local_30) {
        in_RDI[local_30] = in_RDI[iVar3 + -2];
        iVar3 = local_30;
      }
      *in_RDI = uVar1;
    }
    uVar2 = in_RDI[iVar4 + -1];
    if ((in_EDX & 0x1f) != 0) {
      while (local_38 = iVar4 + -1, -1 < local_38) {
        local_44 = uVar2;
        if (local_38 != 0) {
          local_44 = in_RDI[iVar4 + -2];
        }
        sVar5 = (sbyte)(in_EDX & 0x1f);
        in_RDI[local_38] = in_RDI[local_38] << sVar5 | local_44 >> (0x20U - sVar5 & 0x1f);
        iVar4 = local_38;
      }
    }
  }
  return;
}

Assistant:

void lrot32 ( void * blob, int len, int c )
{
  assert((len & 3) == 0);

  int nbytes  = len;
  int ndwords = nbytes/4;

  uint32_t * k = (uint32_t*)blob;

  if(c == 0) return;

  //----------

  int b = c / 32;
  c &= (32-1);

  for(int j = 0; j < b; j++)
  {
    uint32_t t = k[ndwords-1];

    for(int i = ndwords-1; i > 0; i--)
    {
      k[i] = k[i-1];
    }

    k[0] = t;
  }

  uint32_t t = k[ndwords-1];

  if(c == 0) return;

  for(int i = ndwords-1; i >= 0; i--)
  {
    uint32_t a = k[i];
    uint32_t b = (i == 0) ? t : k[i-1];

    k[i] = (a << c) | (b >> (32-c));
  }
}